

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O0

void Game::tumbleTilesDownOnGameboard(GameBoard *gb)

{
  GameBoard *gb_local;
  
  anon_unknown_0::doTumbleTilesDownOnGameboard(gb);
  return;
}

Assistant:

void tumbleTilesDownOnGameboard(GameBoard &gb) {
  doTumbleTilesDownOnGameboard(gb);
}